

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O3

_Bool COSE_Recipient_map_put_int
                (HCOSE_RECIPIENT h,int key,cn_cbor *value,int flags,cose_errback *perr)

{
  _Bool _Var1;
  uint uVar2;
  
  if ((h == (HCOSE_RECIPIENT)0x0) || (_Var1 = _COSE_IsInList(RecipientRoot,(COSE *)h), !_Var1)) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
  }
  else if (value == (cn_cbor *)0x0) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else {
    _Var1 = _COSE_map_put((COSE *)h,key,value,flags,perr);
    if (_Var1) {
      if (key != 1) {
        return true;
      }
      if (value->type == CN_CBOR_INT) {
        if ((value->v).bytes == (uint8_t *)0xfffffffffffffffa) {
          uVar2 = *(uint *)h | 1;
        }
        else {
          uVar2 = *(uint *)h & 0xfffffffe;
        }
        *(uint *)h = uVar2;
        return true;
      }
      *h = (_cose_recipient)((byte)*h & 0xfe);
      return true;
    }
  }
  return false;
}

Assistant:

bool COSE_Recipient_map_put_int(HCOSE_RECIPIENT h, int key, cn_cbor * value, int flags, cose_errback * perr)
{
	CHECK_CONDITION(IsValidRecipientHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(value != NULL, COSE_ERR_INVALID_PARAMETER);

	if (!_COSE_map_put(&((COSE_RecipientInfo *)h)->m_encrypt.m_message, key, value, flags, perr)) return false;

	if (key == COSE_Header_Algorithm) {
		if (value->type == CN_CBOR_INT) {
			switch (value->v.uint) {
			case COSE_Algorithm_Direct:
#ifdef USE_Direct_HKDF_AES_128
			case COSE_Algorithm_Direct_HKDF_AES_128:
#endif
#ifdef USE_Direct_HKDF_AES_256
			case COSE_Algorithm_Direct_HKDF_AES_256:
#endif
#ifdef USE_Direct_HKDF_HMAC_SHA_256
			case COSE_Algorithm_Direct_HKDF_HMAC_SHA_256:
#endif
#ifdef USE_Direct_HKDF_HMAC_SHA_512
			case COSE_Algorithm_Direct_HKDF_HMAC_SHA_512:
#endif
#ifdef USE_ECDH_ES_HKDF_256
			case COSE_Algorithm_ECDH_ES_HKDF_256:
#endif
#ifdef USE_ECDH_ES_HKDF_512
			case COSE_Algorithm_ECDH_ES_HKDF_512:
#endif
#ifdef USE_ECDH_SS_HKDF_256
			case COSE_Algorithm_ECDH_SS_HKDF_256:
#endif
#ifdef USE_ECDH_SS_HKDF_512
			case COSE_Algorithm_ECDH_SS_HKDF_512:
#endif
				((COSE_RecipientInfo *)h)->m_encrypt.m_message.m_flags |= 1;
				break;

			default:
				((COSE_RecipientInfo *)h)->m_encrypt.m_message.m_flags &= ~1;
				break;
			}
		}
		else {
			((COSE_RecipientInfo *)h)->m_encrypt.m_message.m_flags &= ~1;
		}
	}

	return true;

errorReturn:
	return false;
}